

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc * stbi__pnm_load(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int iVar1;
  uchar *puVar2;
  uint n;
  
  iVar1 = stbi__pnm_info(s,(int *)s,(int *)&s->img_y,&s->img_n);
  if (iVar1 != 0) {
    *x = s->img_x;
    *y = s->img_y;
    *comp = s->img_n;
    n = s->img_x * s->img_n * s->img_y;
    puVar2 = (uchar *)malloc((ulong)n);
    if (puVar2 != (uchar *)0x0) {
      stbi__getn(s,puVar2,n);
      if (req_comp == 0) {
        return puVar2;
      }
      iVar1 = s->img_n;
      if (iVar1 == req_comp) {
        return puVar2;
      }
      puVar2 = stbi__convert_format(puVar2,iVar1,req_comp,s->img_x,s->img_y);
      return puVar2;
    }
    stbi__g_failure_reason = "outofmem";
  }
  return (stbi_uc *)0x0;
}

Assistant:

static stbi_uc *stbi__pnm_load(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   stbi_uc *out;
   if (!stbi__pnm_info(s, (int *)&s->img_x, (int *)&s->img_y, (int *)&s->img_n))
      return 0;
   *x = s->img_x;
   *y = s->img_y;
   *comp = s->img_n;

   out = (stbi_uc *) stbi__malloc(s->img_n * s->img_x * s->img_y);
   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   stbi__getn(s, out, s->img_n * s->img_x * s->img_y);

   if (req_comp && req_comp != s->img_n) {
      out = stbi__convert_format(out, s->img_n, req_comp, s->img_x, s->img_y);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }
   return out;
}